

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls-network.c
# Opt level: O3

int lws_tls_check_cert_lifetime(lws_vhost *v)

{
  int iVar1;
  unsigned_long uVar2;
  ulong len;
  lws_tls_cert_info_results ir;
  lws_tls_cert_info_results local_c0;
  lws_vhost *local_78;
  undefined8 local_70;
  undefined8 uStack_68;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 uStack_38;
  undefined8 local_30;
  undefined8 uStack_28;
  undefined8 local_20;
  
  uVar2 = lws_now_secs();
  if (((v->tls).ssl_ctx == (lws_tls_ctx *)0x0) || (((v->tls).field_0x6c & 2) != 0)) {
    len = 0;
    _lws_log(8,"   vhost %s: no cert\n",v->name);
  }
  else {
    if ((long)uVar2 < 0x5bf74cc2) {
      return -1;
    }
    iVar1 = lws_tls_vhost_cert_info(v,LWS_TLS_CERT_INFO_VALIDITY_TO,&local_c0,0);
    if (iVar1 != 0) {
      return 1;
    }
    len = (long)(local_c0.time - uVar2) / 0x15180;
    _lws_log(4,"   vhost %s: cert expiry: %dd\n",v->name,len & 0xffffffff);
  }
  local_30 = 0;
  uStack_28 = 0;
  local_40 = 0;
  uStack_38 = 0;
  local_50 = 0;
  uStack_48 = 0;
  local_60 = 0;
  uStack_58 = 0;
  local_70 = 0;
  uStack_68 = 0;
  local_20 = 0;
  local_78 = v;
  lws_broadcast(v->context->pt,0x48,&local_78,len);
  return 0;
}

Assistant:

int
lws_tls_check_cert_lifetime(struct lws_vhost *v)
{
	time_t now = (time_t)lws_now_secs(), life = 0;
	struct lws_acme_cert_aging_args caa;
	union lws_tls_cert_info_results ir;
	int n;

	if (v->tls.ssl_ctx && !v->tls.skipped_certs) {

		if (now < 1542933698) /* Nov 23 2018 00:42 UTC */
			/* our clock is wrong and we can't judge the certs */
			return -1;

		n = lws_tls_vhost_cert_info(v, LWS_TLS_CERT_INFO_VALIDITY_TO,
					    &ir, 0);
		if (n)
			return 1;

		life = (ir.time - now) / (24 * 3600);
		lwsl_notice("   vhost %s: cert expiry: %dd\n", v->name,
			    (int)life);
	} else
		lwsl_info("   vhost %s: no cert\n", v->name);

	memset(&caa, 0, sizeof(caa));
	caa.vh = v;
	lws_broadcast(&v->context->pt[0], LWS_CALLBACK_VHOST_CERT_AGING, (void *)&caa,
		      (size_t)(ssize_t)life);

	return 0;
}